

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O3

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx,RSA *rsa)

{
  int iVar1;
  UniquePtr<EVP_PKEY> pkey;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  
  if (rsa != (RSA *)0x0) {
    local_18._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
    if (((EVP_PKEY *)local_18._M_head_impl == (EVP_PKEY *)0x0) ||
       (iVar1 = EVP_PKEY_set1_RSA((EVP_PKEY *)local_18._M_head_impl,rsa), iVar1 == 0)) {
      iVar1 = 0;
      ERR_put_error(0x10,0,6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x182);
    }
    else {
      iVar1 = SSL_CTX_use_PrivateKey(ctx,(EVP_PKEY *)local_18._M_head_impl);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
    return iVar1;
  }
  ERR_put_error(0x10,0,0x43,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                ,0x17c);
  return 0;
}

Assistant:

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx, RSA *rsa) {
  if (rsa == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (!pkey || !EVP_PKEY_set1_RSA(pkey.get(), rsa)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_EVP_LIB);
    return 0;
  }

  return SSL_CTX_use_PrivateKey(ctx, pkey.get());
}